

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char16_t *
fmt::v8::detail::
parse_precision<char16_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&>
          (char16_t *begin,char16_t *end,
          specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *handler)

{
  int iVar1;
  char16_t *begin_00;
  char16_t *local_28;
  precision_adapter local_20;
  
  local_28 = begin + 1;
  if (local_28 != end) {
    if ((ushort)*local_28 - 0x30 < 10) {
      iVar1 = parse_nonnegative_int<char16_t>(&local_28,end,-1);
      if (iVar1 == -1) {
        fmt::v8::detail::throw_format_error("number is too big");
      }
      ((handler->super_specs_handler<char16_t>).super_specs_setter<char16_t>.specs_)->precision =
           iVar1;
    }
    else {
      if (*local_28 != L'{') goto LAB_001971e9;
      begin_00 = begin + 2;
      if (begin_00 != end) {
        local_20.handler = handler;
        if ((*begin_00 == L':') || (*begin_00 == L'}')) {
          specs_handler<char16_t>::on_dynamic_precision<fmt::v8::detail::auto_id>
                    (&handler->super_specs_handler<char16_t>);
        }
        else {
          begin_00 = do_parse_arg_id<char16_t,fmt::v8::detail::parse_precision<char16_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&>(char16_t_const*,char16_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&)::precision_adapter&>
                               (begin_00,end,&local_20);
        }
      }
      if ((begin_00 == end) || (local_28 = begin_00 + 1, *begin_00 != L'}')) {
        fmt::v8::detail::throw_format_error("invalid format string");
      }
    }
    specs_checker<fmt::v8::detail::specs_handler<char16_t>_>::end_precision(handler);
    return local_28;
  }
LAB_001971e9:
  fmt::v8::detail::throw_format_error("missing precision specifier");
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}